

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.cpp
# Opt level: O2

void CJobPool::WorkerThread(void *pUser)

{
  long lVar1;
  undefined4 uVar2;
  undefined8 *puVar3;
  
  while (*(char *)((long)pUser + 0x108) == '\0') {
    lock_wait(*(LOCK *)((long)pUser + 0x110));
    lVar1 = *(long *)((long)pUser + 0x118);
    if (lVar1 == 0) {
      lock_unlock(*(LOCK *)((long)pUser + 0x110));
      thread_sleep(10);
    }
    else {
      puVar3 = *(undefined8 **)(lVar1 + 8);
      *(undefined8 **)((long)pUser + 0x118) = puVar3;
      if (puVar3 == (undefined8 *)0x0) {
        puVar3 = (undefined8 *)((long)pUser + 0x120);
      }
      *puVar3 = 0;
      lock_unlock(*(LOCK *)((long)pUser + 0x110));
      *(undefined4 *)(lVar1 + 0x10) = 1;
      uVar2 = (**(code **)(lVar1 + 0x18))(*(undefined8 *)(lVar1 + 0x20));
      *(undefined4 *)(lVar1 + 0x14) = uVar2;
      *(undefined4 *)(lVar1 + 0x10) = 2;
    }
  }
  return;
}

Assistant:

void CJobPool::WorkerThread(void *pUser)
{
	CJobPool *pPool = (CJobPool *)pUser;

	while(!pPool->m_Shutdown)
	{
		CJob *pJob = 0;

		// fetch job from queue
		lock_wait(pPool->m_Lock);
		if(pPool->m_pFirstJob)
		{
			pJob = pPool->m_pFirstJob;
			pPool->m_pFirstJob = pPool->m_pFirstJob->m_pNext;
			if(pPool->m_pFirstJob)
				pPool->m_pFirstJob->m_pPrev = 0;
			else
				pPool->m_pLastJob = 0;
		}
		lock_unlock(pPool->m_Lock);

		// do the job if we have one
		if(pJob)
		{
			pJob->m_Status = CJob::STATE_RUNNING;
			pJob->m_Result = pJob->m_pfnFunc(pJob->m_pFuncData);
			pJob->m_Status = CJob::STATE_DONE;
		}
		else
			thread_sleep(10);
	}

}